

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

void processJob(UA_Server *server,UA_Job *job)

{
  UA_ByteString *message;
  UA_SecureChannel *pUVar1;
  UA_ServerCallback UNRECOVERED_JUMPTABLE;
  UA_Connection *pUVar2;
  
  switch(job->type) {
  case UA_JOBTYPE_NOTHING:
    break;
  case UA_JOBTYPE_DETACHCONNECTION:
    pUVar2 = (job->job).closeConnection;
    pUVar1 = pUVar2->channel;
    if ((pUVar1 != (UA_SecureChannel *)0x0) && (pUVar1->connection == pUVar2)) {
      pUVar1->connection = (UA_Connection *)0x0;
    }
    pUVar2->channel = (UA_SecureChannel *)0x0;
    break;
  case UA_JOBTYPE_BINARYMESSAGE_NETWORKLAYER:
    pUVar2 = (UA_Connection *)&(job->job).binaryMessage.message;
    UA_Server_processBinaryMessage(server,(job->job).closeConnection,(UA_ByteString *)pUVar2);
    server = (UA_Server *)(job->job).closeConnection;
    UNRECOVERED_JUMPTABLE = *(UA_ServerCallback *)&server->config;
    goto LAB_0011c3ae;
  case UA_JOBTYPE_BINARYMESSAGE_ALLOCATED:
    message = &(job->job).binaryMessage.message;
    UA_Server_processBinaryMessage(server,(job->job).closeConnection,message);
    deleteMembers_noInit(message,UA_TYPES + 0xe);
    (job->job).binaryMessage.message.length = 0;
    (job->job).binaryMessage.message.data = (UA_Byte *)0x0;
    break;
  case UA_JOBTYPE_METHODCALL:
  case UA_JOBTYPE_METHODCALL_DELAYED:
    pUVar2 = (job->job).closeConnection;
    UNRECOVERED_JUMPTABLE = (job->job).methodCall.method;
LAB_0011c3ae:
    (*UNRECOVERED_JUMPTABLE)((UA_Connection *)server,(UA_ByteString *)pUVar2);
    return;
  default:
    UA_LOG_WARNING((server->config).logger,UA_LOGCATEGORY_SERVER,
                   "Trying to execute a job of unknown type");
    return;
  }
  return;
}

Assistant:

static void
processJob(UA_Server *server, UA_Job *job) {
    UA_ASSERT_RCU_UNLOCKED();
    UA_RCU_LOCK();
    switch(job->type) {
    case UA_JOBTYPE_NOTHING:
        break;
    case UA_JOBTYPE_DETACHCONNECTION:
        UA_Connection_detachSecureChannel(job->job.closeConnection);
        break;
    case UA_JOBTYPE_BINARYMESSAGE_NETWORKLAYER:
        UA_Server_processBinaryMessage(server, job->job.binaryMessage.connection,
                                       &job->job.binaryMessage.message);
        UA_Connection *connection = job->job.binaryMessage.connection;
        connection->releaseRecvBuffer(connection, &job->job.binaryMessage.message);
        break;
    case UA_JOBTYPE_BINARYMESSAGE_ALLOCATED:
        UA_Server_processBinaryMessage(server, job->job.binaryMessage.connection,
                                       &job->job.binaryMessage.message);
        UA_ByteString_deleteMembers(&job->job.binaryMessage.message);
        break;
    case UA_JOBTYPE_METHODCALL:
    case UA_JOBTYPE_METHODCALL_DELAYED:
        job->job.methodCall.method(server, job->job.methodCall.data);
        break;
    default:
        UA_LOG_WARNING(server->config.logger, UA_LOGCATEGORY_SERVER,
                       "Trying to execute a job of unknown type");
        break;
    }
    UA_RCU_UNLOCK();
}